

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safeint-test.cc
# Opt level: O0

void __thiscall SafeIntTest_Mul_Test::TestBody(SafeIntTest_Mul_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  AssertHelper *this_00;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int in_stack_fffffffffffffebc;
  AssertHelper *in_stack_fffffffffffffec0;
  int *in_stack_fffffffffffffec8;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  char *in_stack_fffffffffffffed8;
  int line;
  char *in_stack_fffffffffffffee0;
  AssertionResult *this_02;
  Type in_stack_fffffffffffffeec;
  Type type;
  AssertHelper *in_stack_fffffffffffffef0;
  SafeInt<int> local_d0;
  int local_cc;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 uVar4;
  AssertHelper *in_stack_ffffffffffffff40;
  SafeInt<int> local_a0;
  int local_9c;
  int local_98;
  undefined4 local_94;
  AssertionResult local_90 [2];
  SafeInt<int> local_70;
  int local_6c;
  int local_68;
  undefined4 local_64;
  AssertionResult local_60 [3];
  SafeInt<int> local_2c;
  SafeInt<int> local_28;
  int local_24;
  int local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0x2a;
  mp::SafeInt<int>::SafeInt(&local_28,6);
  mp::SafeInt<int>::SafeInt(&local_2c,7);
  local_24 = (int)mp::operator*((SafeInt<int>)(int)in_stack_fffffffffffffee0,
                                (SafeInt<int>)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  local_20 = mp::val((SafeInt<int>)local_24);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffed8,
             (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffef0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10d6cf);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff40,
               (Message *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffec0);
    testing::Message::~Message((Message *)0x10d72c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d784);
  local_64 = 0x2a;
  mp::SafeInt<int>::SafeInt(&local_70,6);
  local_6c = (int)mp::operator*((SafeInt<int>)(int)in_stack_fffffffffffffec0,
                                in_stack_fffffffffffffebc);
  local_68 = mp::val((SafeInt<int>)local_6c);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffed8,
             (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffef0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10d862);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff40,
               (Message *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffec0);
    testing::Message::~Message((Message *)0x10d8bf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d917);
  local_94 = 0x2a;
  mp::SafeInt<int>::SafeInt(&local_a0,7);
  local_9c = (int)mp::operator*(in_stack_fffffffffffffebc,
                                (SafeInt<int>)(int)in_stack_fffffffffffffec0);
  local_98 = mp::val((SafeInt<int>)local_9c);
  this_02 = local_90;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffed8,
             (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeec);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffed8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10d9f5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffef0,type,&this_02->success_,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff40,
               (Message *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffec0);
    testing::Message::~Message((Message *)0x10da52);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10daaa);
  uVar4 = 0x7ffffffe;
  mp::SafeInt<int>::SafeInt(&local_d0,0x3fffffff);
  local_cc = (int)mp::operator*((SafeInt<int>)(int)in_stack_fffffffffffffec0,
                                in_stack_fffffffffffffebc);
  iVar3 = mp::val((SafeInt<int>)local_cc);
  this_01 = (AssertionResult *)&stack0xffffffffffffff40;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffed8,
             (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),(int *)this_01,
             (int *)in_stack_fffffffffffffec0);
  line = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffef0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10db79)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffef0,type,&this_02->success_,line,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffed0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff40,(Message *)CONCAT44(uVar4,iVar3));
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x10dbc7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10dc16);
  return;
}

Assistant:

TEST(SafeIntTest, Mul) {
  EXPECT_EQ(42, val(SafeInt<int>(6) * SafeInt<int>(7)));
  EXPECT_EQ(42, val(SafeInt<int>(6) * 7));
  EXPECT_EQ(42, val(6 * SafeInt<int>(7)));
  EXPECT_EQ(INT_MAX & ~1, val(SafeInt<int>(INT_MAX / 2) * 2));
}